

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_HealObj(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  PClass *pPVar3;
  undefined4 extraout_var;
  
  if (this->t_argc == 0) {
    pAVar2 = (this->Script->trigger).field_0.p;
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050a59c;
      (this->Script->trigger).field_0.p = (AActor *)0x0;
    }
    pAVar2 = (AActor *)0x0;
  }
  else {
    pAVar2 = actorvalue(this->t_argv);
    if (1 < this->t_argc) {
      if (this->t_argc != 2) {
        script_error("invalid number of arguments for objheal");
        return;
      }
      iVar1 = intvalue(this->t_argv + 1);
      iVar1 = iVar1 + pAVar2->health;
      goto LAB_0050a5be;
    }
  }
LAB_0050a59c:
  pPVar3 = (pAVar2->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar1 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
    (pAVar2->super_DThinker).super_DObject.Class = pPVar3;
  }
  iVar1 = *(int *)(pPVar3->Defaults + 0x1fc);
LAB_0050a5be:
  pAVar2->health = iVar1;
  if (pAVar2->player != (player_t *)0x0) {
    pAVar2->player->health = iVar1;
  }
  return;
}

Assistant:

void FParser::SF_HealObj()  //no pain sound
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(t_argc < 2)
	{
		mo->health = mo->GetDefault()->health;
		if(mo->player) mo->player->health = mo->health;
	}

	else if (t_argc == 2)
	{
		mo->health += intvalue(t_argv[1]);
		if(mo->player) mo->player->health = mo->health;
	}

	else
		script_error("invalid number of arguments for objheal");
}